

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

string * __thiscall
LTFlightData::FDKeyTy::SetKey_abi_cxx11_
          (string *__return_storage_ptr__,FDKeyTy *this,FDKeyType _eType,unsigned_long _num)

{
  string *psVar1;
  LTError *this_00;
  char *__format;
  char buf [50];
  
  this->eKeyType = _eType;
  this->num = _num;
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  switch(_eType) {
  case KEY_UNKNOWN:
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                     ,0x115,"SetKey",logFATAL,"ASSERT FAILED: %s","eKeyType!=KEY_UNKNOWN");
    goto LAB_0015998c;
  case KEY_OGN:
  case KEY_RT:
    __format = "%08lX";
    break;
  case KEY_FLARM:
  case KEY_ICAO:
  case KEY_FSC:
  case KEY_ADSBEX:
    __format = "%06lX";
    break;
  case KEY_SAYINTENTIONS:
    __format = "%lu";
    break;
  default:
    goto switchD_001598f2_default;
  }
  snprintf(buf,0x32,__format);
  if (buf[0] != '\0') {
    psVar1 = (string *)std::__cxx11::string::assign((char *)&this->key);
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
    return __return_storage_ptr__;
  }
switchD_001598f2_default:
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                   ,0x118,"SetKey",logFATAL,"ASSERT FAILED: %s","buf[0]");
LAB_0015998c:
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string LTFlightData::FDKeyTy::SetKey (FDKeyType _eType, unsigned long _num)
{
    eKeyType = _eType;
    num = _num;

    // convert to uppercase hex string
    char buf[50] = "";
    switch(_eType) {
        case KEY_ICAO:
        case KEY_FLARM:
        case KEY_FSC:
        case KEY_ADSBEX:
            snprintf(buf, sizeof(buf), "%06lX", _num);
            break;
        case KEY_OGN:
        case KEY_RT:
            snprintf(buf, sizeof(buf), "%08lX", _num);
            break;
        case KEY_SAYINTENTIONS:
            snprintf(buf, sizeof(buf), "%lu", _num);
            break;
        case KEY_UNKNOWN:
            // must not happen
            LOG_ASSERT(eKeyType!=KEY_UNKNOWN);
            break;
    }
    LOG_ASSERT(buf[0]);
    return key = buf;
}